

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateRangeAffinityStr(Expr *pRight,int n,char *zAff)

{
  char cVar1;
  int iVar2;
  long in_RDX;
  int in_ESI;
  Expr *p;
  int i;
  Expr *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  
  local_1c = 0;
  do {
    if (in_ESI <= local_1c) {
      return;
    }
    in_stack_ffffffffffffffd8 = sqlite3VectorFieldSubexpr(in_stack_ffffffffffffffd8,0);
    cVar1 = sqlite3CompareAffinity(in_stack_ffffffffffffffd8,'\0');
    if (cVar1 == 'A') {
LAB_0020c979:
      *(undefined1 *)(in_RDX + local_1c) = 0x41;
    }
    else {
      iVar2 = sqlite3ExprNeedsNoAffinityChange
                        (in_stack_ffffffffffffffd8,*(char *)(in_RDX + local_1c));
      if (iVar2 != 0) goto LAB_0020c979;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static void updateRangeAffinityStr(
  Expr *pRight,                   /* RHS of comparison */
  int n,                          /* Number of vector elements in comparison */
  char *zAff                      /* Affinity string to modify */
){
  int i;
  for(i=0; i<n; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pRight, i);
    if( sqlite3CompareAffinity(p, zAff[i])==SQLITE_AFF_BLOB
     || sqlite3ExprNeedsNoAffinityChange(p, zAff[i])
    ){
      zAff[i] = SQLITE_AFF_BLOB;
    }
  }
}